

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O0

int pbrt::TerminalWidth(void)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  uint *puVar3;
  winsize w;
  undefined1 local_c [2];
  ushort local_a;
  uint local_4;
  
  iVar1 = ioctl(1,0x5413,local_c);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    if ((*piVar2 != 0x19) && ((TerminalWidth::warned & 1U) == 0)) {
      TerminalWidth::warned = true;
      puVar3 = (uint *)__errno_location();
      fprintf(__stream,"Error in ioctl() in TerminalWidth(): %d\n",(ulong)*puVar3);
    }
    local_4 = 0x50;
  }
  else {
    local_4 = (uint)local_a;
  }
  return local_4;
}

Assistant:

static int TerminalWidth() {
#ifdef PBRT_IS_WINDOWS
    HANDLE h = GetStdHandle(STD_OUTPUT_HANDLE);
    if (h == INVALID_HANDLE_VALUE || !h) {
        fprintf(stderr, "GetStdHandle() call failed");
        return 80;
    }
    CONSOLE_SCREEN_BUFFER_INFO bufferInfo = {0};
    GetConsoleScreenBufferInfo(h, &bufferInfo);
    return bufferInfo.dwSize.X;
#else
    struct winsize w;
    if (ioctl(STDOUT_FILENO, TIOCGWINSZ, &w) < 0) {
        // ENOTTY is fine and expected, e.g. if output is being piped to a file.
        if (errno != ENOTTY) {
            static bool warned = false;
            if (!warned) {
                warned = true;
                fprintf(stderr, "Error in ioctl() in TerminalWidth(): %d\n", errno);
            }
        }
        return 80;
    }
    return w.ws_col;
#endif  // PBRT_IS_WINDOWS
}